

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfilesystementry.cpp
# Opt level: O1

QString * __thiscall
QFileSystemEntry::fileName(QString *__return_storage_ptr__,QFileSystemEntry *this)

{
  findLastSeparator(this);
  QString::mid(__return_storage_ptr__,&this->m_filePath,(long)this->m_lastSeparator + 1,-1);
  return __return_storage_ptr__;
}

Assistant:

QString QFileSystemEntry::fileName() const
{
    findLastSeparator();
#if defined(Q_OS_WIN)
    if (m_lastSeparator == -1 && m_filePath.length() >= 2 && m_filePath.at(1) == u':')
        return m_filePath.mid(2);
#endif
    return m_filePath.mid(m_lastSeparator + 1);
}